

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall kratos::Var::set_width_param(Var *this,Var *param)

{
  bool bVar1;
  unordered_set<kratos::Param_*,_std::hash<kratos::Param_*>,_std::equal_to<kratos::Param_*>,_std::allocator<kratos::Param_*>_>
  *puVar2;
  reference ppPVar3;
  value_type *p_1;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_set<kratos::Param_*,_std::hash<kratos::Param_*>,_std::equal_to<kratos::Param_*>,_std::allocator<kratos::Param_*>_>
  *__range1;
  unordered_set<kratos::Param_*,_std::hash<kratos::Param_*>,_std::equal_to<kratos::Param_*>,_std::allocator<kratos::Param_*>_>
  *params;
  ParamVisitor visitor;
  uint64_t value;
  value_type *p;
  const_iterator __end3;
  const_iterator __begin3;
  unordered_set<kratos::Param_*,_std::hash<kratos::Param_*>,_std::equal_to<kratos::Param_*>,_std::allocator<kratos::Param_*>_>
  *__range3;
  unordered_set<kratos::Param_*,_std::hash<kratos::Param_*>,_std::equal_to<kratos::Param_*>,_std::allocator<kratos::Param_*>_>
  *params_1;
  undefined1 local_98 [8];
  ParamVisitor visitor_1;
  Var *param_local;
  Var *this_local;
  
  visitor_1.params_._M_h._M_single_bucket = (__node_base_ptr)param;
  if (param == (Var *)0x0) {
    if (this->width_param_ != (Var *)0x0) {
      ParamVisitor::ParamVisitor((ParamVisitor *)local_98);
      IRVisitor::visit_root((IRVisitor *)local_98,&this->width_param_->super_IRNode);
      puVar2 = ParamVisitor::params((ParamVisitor *)local_98);
      __end3 = std::
               unordered_set<kratos::Param_*,_std::hash<kratos::Param_*>,_std::equal_to<kratos::Param_*>,_std::allocator<kratos::Param_*>_>
               ::begin(puVar2);
      p = (value_type *)
          std::
          unordered_set<kratos::Param_*,_std::hash<kratos::Param_*>,_std::equal_to<kratos::Param_*>,_std::allocator<kratos::Param_*>_>
          ::end(puVar2);
      while( true ) {
        bVar1 = std::__detail::operator!=
                          (&__end3.super__Node_iterator_base<kratos::Param_*,_false>,
                           (_Node_iterator_base<kratos::Param_*,_false> *)&p);
        if (!bVar1) break;
        ppPVar3 = std::__detail::_Node_const_iterator<kratos::Param_*,_true,_false>::operator*
                            (&__end3);
        Param::add_param_width_var(*ppPVar3,this);
        std::__detail::_Node_const_iterator<kratos::Param_*,_true,_false>::operator++(&__end3);
      }
      ParamVisitor::~ParamVisitor((ParamVisitor *)local_98);
    }
    this->width_param_ = (Var *)0x0;
  }
  else {
    visitor.params_._M_h._M_single_bucket = (__node_base_ptr)Simulator::static_evaluate_expr(param);
    this->var_width_ = (uint32_t)visitor.params_._M_h._M_single_bucket;
    this->width_param_ = (Var *)visitor_1.params_._M_h._M_single_bucket;
    ParamVisitor::ParamVisitor((ParamVisitor *)&params);
    IRVisitor::visit_root((IRVisitor *)&params,(IRNode *)visitor_1.params_._M_h._M_single_bucket);
    puVar2 = ParamVisitor::params((ParamVisitor *)&params);
    __end1 = std::
             unordered_set<kratos::Param_*,_std::hash<kratos::Param_*>,_std::equal_to<kratos::Param_*>,_std::allocator<kratos::Param_*>_>
             ::begin(puVar2);
    p_1 = (value_type *)
          std::
          unordered_set<kratos::Param_*,_std::hash<kratos::Param_*>,_std::equal_to<kratos::Param_*>,_std::allocator<kratos::Param_*>_>
          ::end(puVar2);
    while( true ) {
      bVar1 = std::__detail::operator!=
                        (&__end1.super__Node_iterator_base<kratos::Param_*,_false>,
                         (_Node_iterator_base<kratos::Param_*,_false> *)&p_1);
      if (!bVar1) break;
      ppPVar3 = std::__detail::_Node_const_iterator<kratos::Param_*,_true,_false>::operator*
                          (&__end1);
      Param::add_param_width_var(*ppPVar3,this);
      std::__detail::_Node_const_iterator<kratos::Param_*,_true,_false>::operator++(&__end1);
    }
    ParamVisitor::~ParamVisitor((ParamVisitor *)&params);
  }
  return;
}

Assistant:

void Var::set_width_param(Var *param) {
    if (param == nullptr) {
        if (width_param_) {
            ParamVisitor visitor;
            visitor.visit_root(width_param_);
            auto const &params = visitor.params();
            for (const auto &p : params) {
                p->add_param_width_var(this);
            }
        }
        width_param_= nullptr;
        return;
    }
    // set width to the current param value
    auto value = Simulator::static_evaluate_expr(param);
    var_width_ = value;
    width_param_ = param;

    // get all the parameters
    ParamVisitor visitor;
    visitor.visit_root(param);
    auto const &params = visitor.params();
    for (const auto &p : params) {
        p->add_param_width_var(this);
    }
}